

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O3

void __thiscall V2MPlayer::Play(V2MPlayer *this,uint32_t a_time)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  
  if (((this->m_base).valid == true) && (this->m_samplerate != 0)) {
    (this->m_state).state = OFF;
    Reset(this);
    (this->m_base).valid = false;
    uVar7 = this->m_samplerate;
    uVar4 = this->m_tpc;
    uVar8 = 0;
    (this->m_state).state = PLAYING;
    (this->m_state).smpldelta = 0;
    (this->m_state).smplrem = 0;
    uVar6 = 0;
    uVar7 = (uint)(((ulong)uVar7 * (ulong)a_time) / (ulong)uVar4);
    if (uVar7 != 0) {
      uVar4 = 0;
      do {
        uVar8 = uVar4;
        Tick(this);
        if ((this->m_state).state != PLAYING) {
          uVar6 = 0xffffffff;
          break;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)((this->m_state).nexttime - (this->m_state).time) *
                       (ulong)(this->m_state).usecs;
        auVar2 = auVar2 / ZEXT416((this->m_base).timediv2);
        puVar1 = &(this->m_state).smplrem;
        uVar4 = *puVar1;
        uVar5 = auVar2._4_4_;
        *puVar1 = *puVar1 + uVar5;
        iVar3 = auVar2._0_4_;
        uVar6 = iVar3 + (uint)CARRY4(uVar4,uVar5);
        (this->m_state).smpldelta = uVar6;
        uVar4 = iVar3 + uVar8 + (uint)CARRY4(uVar4,uVar5);
      } while (uVar4 < uVar7);
    }
    (this->m_state).cursmpl = uVar8;
    (this->m_state).smpldelta = (uVar8 - uVar7) + uVar6;
    this->m_fadeval = 1.0;
    this->m_fadedelta = 0.0;
    (this->m_base).valid = true;
  }
  return;
}

Assistant:

void V2MPlayer::Play(uint32_t a_time)
{
    if (!m_base.valid || !m_samplerate)
        return;

    Stop();
    Reset();

    m_base.valid = sFALSE;
    uint32_t destsmpl, cursmpl = 0;
    {
        destsmpl = ((uint64_t)a_time * m_samplerate) / m_tpc;
    }

    m_state.state = PlayerState::PLAYING;
    m_state.smpldelta = 0;
    m_state.smplrem = 0;
    while ((cursmpl + m_state.smpldelta) < destsmpl && m_state.state == PlayerState::PLAYING)
    {
        cursmpl += m_state.smpldelta;
        Tick();
        if (m_state.state == PlayerState::PLAYING) {
            m_state.smpldelta = 0;
            UpdateSampleDelta(m_state.nexttime, m_state.time, m_state.usecs, m_base.timediv2, &m_state.smplrem, &m_state.smpldelta);
        } else
            m_state.smpldelta = -1;
    }

    m_state.cursmpl    = cursmpl;
    m_state.smpldelta -= (destsmpl - cursmpl);
    m_fadeval    = 1.0f;
    m_fadedelta  = 0.0f;
    m_base.valid = sTRUE;
}